

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

bool __thiscall google::protobuf::io::CordInputStream::NextChunk(CordInputStream *this,size_t skip)

{
  char **ppcVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  long lVar5;
  size_t sVar6;
  ulong n;
  
  if (this->size_ == 0) {
    return false;
  }
  n = (this->size_ - this->available_) + skip;
  uVar2 = (this->it_).chunk_iterator_.bytes_remaining_;
  if (n <= uVar2) {
    uVar3 = (this->it_).chunk_iterator_.current_chunk_._M_len;
    sVar6 = uVar3 - n;
    if (uVar3 < n || sVar6 == 0) {
      if (n != 0) {
        lVar5 = (long)(this->it_).chunk_iterator_.btree_reader_.navigator_.height_;
        if ((lVar5 < 0) ||
           ((this->it_).chunk_iterator_.btree_reader_.navigator_.node_[lVar5] == (CordRepBtree *)0x0
           )) {
          (this->it_).chunk_iterator_.bytes_remaining_ = 0;
        }
        else {
          absl::lts_20240722::Cord::ChunkIterator::AdvanceBytesBtree(&(this->it_).chunk_iterator_,n)
          ;
        }
      }
    }
    else {
      ppcVar1 = &(this->it_).chunk_iterator_.current_chunk_._M_str;
      *ppcVar1 = *ppcVar1 + n;
      (this->it_).chunk_iterator_.current_chunk_._M_len = sVar6;
      (this->it_).chunk_iterator_.bytes_remaining_ = uVar2 - n;
    }
    this->bytes_remaining_ = this->bytes_remaining_ - skip;
    bVar4 = LoadChunkData(this);
    return bVar4;
  }
  __assert_fail("bytes_remaining_ >= n",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/strings/cord.h"
                ,0x647,"void absl::Cord::ChunkIterator::AdvanceBytes(size_t)");
}

Assistant:

bool CordInputStream::NextChunk(size_t skip) {
  // `size_ == 0` indicates we're at EOF.
  if (size_ == 0) return false;

  // The caller consumed 'size_ - available_' bytes that are not yet accounted
  // for in the iterator position to get to the start of the next chunk.
  const size_t distance = size_ - available_ + skip;
  absl::Cord::Advance(&it_, distance);
  bytes_remaining_ -= skip;

  return LoadChunkData();
}